

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_fill_code(uint8_t **out,uint32_t *xor1,uint32_t *xor2,uint32_t *bcode)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  uint32_t k;
  long lVar5;
  uint32_t *puVar6;
  uint8_t uVar7;
  
  uVar3 = bcode[1] << 3 | bcode[2] << 6 | bcode[3] << 9 |
          bcode[4] << 0xc | bcode[5] << 0xf | bcode[6] << 0x12 | bcode[7] << 0x15 | *bcode;
  puVar1 = *out;
  *out = puVar1 + 1;
  *puVar1 = (uint8_t)(uVar3 >> 0x10);
  puVar1 = *out;
  *out = puVar1 + 1;
  *puVar1 = (uint8_t)(uVar3 >> 8);
  puVar1 = *out;
  *out = puVar1 + 1;
  *puVar1 = (uint8_t)uVar3;
  lVar4 = 0;
  lVar5 = 0;
  do {
    if (lVar4 == 0x20) {
      return;
    }
    if (6 < *(int *)((long)bcode + lVar4) - 1U) goto LAB_00106701;
    puVar6 = xor1 + lVar5;
    switch(*(int *)((long)bcode + lVar4)) {
    case 4:
      uVar7 = *(uint8_t *)((long)xor1 + lVar4 + 3);
      puVar1 = *out;
      *out = puVar1 + 1;
      *puVar1 = uVar7;
    case 3:
      uVar7 = *(uint8_t *)((long)xor1 + lVar4 + 2);
      puVar1 = *out;
      *out = puVar1 + 1;
      *puVar1 = uVar7;
    case 2:
      uVar7 = *(uint8_t *)((long)xor1 + lVar4 + 1);
      goto LAB_001066e4;
    case 6:
      uVar7 = *(uint8_t *)((long)xor2 + lVar4 + 1);
      puVar1 = *out;
      *out = puVar1 + 1;
      *puVar1 = uVar7;
    case 5:
      puVar6 = xor2 + lVar5;
      break;
    case 7:
      puVar6 = (uint32_t *)((long)xor2 + lVar4);
      uVar7 = *(uint8_t *)((long)xor2 + lVar4 + 2);
      puVar1 = *out;
      *out = puVar1 + 1;
      *puVar1 = uVar7;
      uVar7 = *(uint8_t *)((long)xor2 + lVar4 + 1);
LAB_001066e4:
      puVar1 = *out;
      *out = puVar1 + 1;
      *puVar1 = uVar7;
    }
    uVar2 = *puVar6;
    puVar1 = *out;
    *out = puVar1 + 1;
    *puVar1 = (uint8_t)uVar2;
LAB_00106701:
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

static inline void trico_fill_code(uint8_t** out, uint32_t* xor1, uint32_t* xor2, uint32_t* bcode)
  {
  uint32_t bc = (bcode[7] << 21) | (bcode[6] << 18) | (bcode[5] << 15) | (bcode[4] << 12) | (bcode[3] << 9) | (bcode[2] << 6) | (bcode[1] << 3) | bcode[0];

  *(*out)++ = (uint8_t)(bc >> 16);
  *(*out)++ = (uint8_t)((bc >> 8) & 0xff);
  *(*out)++ = (uint8_t)(bc & 0xff);

  for (uint32_t k = 0; k < 8; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }